

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall cs_impl::any::any<cs::type_id>(any *this,type_id *dat)

{
  _func_int **pp_Var1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_0025e798 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = (baseHolder *)(&cs::null_pointer)[DAT_0025e798];
    DAT_0025e798 = DAT_0025e798 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00254e58;
  pp_Var1 = (_func_int **)dat->type_hash;
  pbVar2[1]._vptr_baseHolder = (_func_int **)(dat->type_idx)._M_target;
  pbVar2[2]._vptr_baseHolder = pp_Var1;
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 0;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}